

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::visitAtomicNotify(FunctionValidator *this,AtomicNotify *curr)

{
  Memory *pMVar1;
  
  pMVar1 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->memory).super_IString.str);
  shouldBeTrue<wasm::AtomicNotify*>
            (this,pMVar1 != (Memory *)0x0,curr,"memory.atomicNotify memory must exist");
  shouldBeTrue<wasm::AtomicNotify*>
            (this,(bool)((byte)(((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .
                                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .currModule)->features).features & 1),curr,
             "Atomic operations require threads [--enable-threads]");
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicNotify*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression.
                        type.id,(Type)0x2,curr,"AtomicNotify must have type i32");
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicNotify*,wasm::Type>
            (this,(Type)(curr->ptr->type).id,(Type)(pMVar1->addressType).id,curr,
             "AtomicNotify pointer must match memory index type");
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicNotify*,wasm::Type>
            (this,(Type)(curr->notifyCount->type).id,(Type)0x2,curr,
             "AtomicNotify notifyCount type must be i32");
  return;
}

Assistant:

void FunctionValidator::visitAtomicNotify(AtomicNotify* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.atomicNotify memory must exist");
  shouldBeTrue(getModule()->features.hasAtomics(),
               curr,
               "Atomic operations require threads [--enable-threads]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::i32), curr, "AtomicNotify must have type i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    memory->addressType,
    curr,
    "AtomicNotify pointer must match memory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->notifyCount->type,
    Type(Type::i32),
    curr,
    "AtomicNotify notifyCount type must be i32");
}